

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O2

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<long,_std::allocator<long>_> *container)

{
  int64 *piVar1;
  int64 value;
  OneHotEncoder *this_00;
  Int64Vector *this_01;
  int64 *piVar2;
  
  this_00 = Specification::Model::mutable_onehotencoder
                      ((this->super_Model).m_spec.
                       super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  Specification::OneHotEncoder::clear_int64categories(this_00);
  piVar1 = (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    value = *piVar2;
    this_01 = Specification::OneHotEncoder::mutable_int64categories(this_00);
    Specification::Int64Vector::add_vector(this_01,value);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<int64_t>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_int64categories();

        for (auto element : container) {
            ohe->mutable_int64categories()->add_vector(element);
        }
        return Result();
    }